

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

bool __thiscall van_kampen::GroupElement::operator==(GroupElement *this,GroupElement *other)

{
  __type_conflict _Var1;
  bool local_19;
  GroupElement *other_local;
  GroupElement *this_local;
  
  _Var1 = std::operator==(&this->name,&other->name);
  local_19 = false;
  if (_Var1) {
    local_19 = (this->reversed & 1U) == (other->reversed & 1U);
  }
  return local_19;
}

Assistant:

bool GroupElement::operator==(const GroupElement &other) const
{
    return name == other.name && reversed == other.reversed;
}